

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TType * __thiscall
glslang::HlslParseContext::getStructBufferContentType(HlslParseContext *this,TType *type)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  HlslParseContext *local_38;
  TType *contentType;
  int memberCount;
  TType *type_local;
  HlslParseContext *this_local;
  
  iVar1 = (*type->_vptr_TType[7])();
  if ((iVar1 == 0x10) &&
     (iVar1 = (*type->_vptr_TType[0xb])(),
     ((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f) == 6)) {
    pvVar3 = &TType::getStruct(type)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                      (pvVar3);
    if ((int)sVar4 < 1) {
      __assert_fail("memberCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0x1b5d,
                    "TType *glslang::HlslParseContext::getStructBufferContentType(const TType &) const"
                   );
    }
    pvVar3 = &TType::getStruct(type)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (pvVar3,(long)((int)sVar4 + -1));
    local_38 = (HlslParseContext *)pvVar5->type;
    uVar2 = (*(local_38->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1f])()
    ;
    if ((uVar2 & 1) == 0) {
      local_38 = (HlslParseContext *)0x0;
    }
    this_local = local_38;
  }
  else {
    this_local = (HlslParseContext *)0x0;
  }
  return (TType *)this_local;
}

Assistant:

TType* HlslParseContext::getStructBufferContentType(const TType& type) const
{
    if (type.getBasicType() != EbtBlock || type.getQualifier().storage != EvqBuffer)
        return nullptr;

    const int memberCount = (int)type.getStruct()->size();
    assert(memberCount > 0);

    TType* contentType = (*type.getStruct())[memberCount-1].type;

    return contentType->isUnsizedArray() ? contentType : nullptr;
}